

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_top_p_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  float fVar5;
  
  pfVar1 = (float *)smpl->ctx;
  if (*pfVar1 < 1.0) {
    llama_sampler_softmax_impl(cur_p);
    fVar5 = 0.0;
    lVar4 = 8;
    for (uVar3 = 1;
        (uVar2 = cur_p->size, uVar3 - cur_p->size != 1 &&
        ((fVar5 = fVar5 + *(float *)((long)&cur_p->data->id + lVar4), fVar5 < *pfVar1 ||
         (uVar2 = uVar3, uVar3 < *(ulong *)(pfVar1 + 2))))); uVar3 = uVar3 + 1) {
      lVar4 = lVar4 + 0xc;
    }
    cur_p->size = uVar2;
  }
  return;
}

Assistant:

static void llama_sampler_top_p_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    const auto * ctx = (llama_sampler_top_p *) smpl->ctx;

    if (ctx->p >= 1.0f) {
        return;
    }

    llama_sampler_softmax_impl(cur_p);

    // Compute the cumulative probabilities
    float cum_sum = 0.0f;
    size_t last_idx = cur_p->size;

    for (size_t i = 0; i < cur_p->size; ++i) {
        cum_sum += cur_p->data[i].p;

        // Check if the running sum is at least p or if we have kept at least min_keep tokens
        // we set the last index to i+1 to indicate that the current iterate should be included in the set
        if (cum_sum >= ctx->p && i + 1 >= ctx->min_keep) {
            last_idx = i + 1;
            break;
        }
    }

    // Resize the output vector to keep only the top-p tokens
    cur_p->size = last_idx;
}